

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_impl::on_lsd_peer(session_impl *this,endpoint *peer,sha1_hash *ih)

{
  _Atomic_word *p_Var1;
  int *piVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  element_type *peVar7;
  _WordT _Var8;
  int iVar9;
  undefined8 this_00;
  session_logger this_01;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 local_88 [8];
  anon_union_16_3_a3f0114d_for___in6_u local_80;
  lsd_callback local_70;
  string local_68;
  undefined1 local_44 [16];
  
  counters::inc_stats_counter(&this->m_stats_counters,0x3d,1);
  local_68.field_2._M_allocated_capacity._0_4_ = (ih->m_number)._M_elems[4];
  local_68._M_dataplus._M_p = *(pointer *)(ih->m_number)._M_elems;
  local_68._M_string_length = *(size_type *)((ih->m_number)._M_elems + 2);
  local_68.field_2._M_allocated_capacity._4_4_ = 0;
  stack0xffffffffffffffb0 = SUB1612((undefined1  [16])0x0,4);
  local_44 = (undefined1  [16])0x0;
  find_torrent((session_impl *)local_88,(info_hash_t *)this);
  this_00 = local_80._0_8_;
  if ((_func_int **)local_80._0_8_ != (_func_int **)0x0) {
    iVar9 = *(_Atomic_word *)(local_80._0_8_ + 8);
    do {
      if (iVar9 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar3 = *(_Atomic_word *)(local_80._0_8_ + 8);
      bVar10 = iVar9 == iVar3;
      if (bVar10) {
        *(_Atomic_word *)(local_80._0_8_ + 8) = iVar9 + 1;
        iVar3 = iVar9;
      }
      iVar9 = iVar3;
      UNLOCK();
    } while (!bVar10);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar10 = true;
  }
  else {
    bVar10 = *(_Atomic_word *)(this_00 + 8) == 0;
  }
  this_01._vptr_session_logger = (_func_int **)local_88;
  if (bVar10) {
    this_01._vptr_session_logger = (_func_int **)(torrent *)0x0;
  }
  if ((_func_int **)local_80._0_8_ != (_func_int **)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(local_80._0_8_ + 0xc);
      iVar9 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar9 = *(_Atomic_word *)(local_80._0_8_ + 0xc);
      *(int *)(local_80._0_8_ + 0xc) = iVar9 + -1;
    }
    if (iVar9 == 1) {
      (**(code **)(*(long *)local_80._0_8_ + 0x18))();
    }
  }
  if (((torrent *)this_01._vptr_session_logger != (torrent *)0x0) &&
     (bVar4 = (((((shared_ptr<libtorrent::torrent_info> *)(this_01._vptr_session_logger + 3))->
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              m_flags).m_val, (bVar4 & 2) == 0)) {
    if ((bVar4 & 4) != 0) {
      local_68._M_dataplus._M_p = (pointer)&(this->m_settings).m_mutex;
      local_68._M_string_length = local_68._M_string_length & 0xffffffffffffff00;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_68);
      local_68._M_string_length = CONCAT71(local_68._M_string_length._1_7_,1);
      _Var8 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[0];
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_68);
      if (((uint)_Var8 >> 0x17 & 1) == 0) goto LAB_002d49e8;
    }
    peVar7 = (((shared_ptr<libtorrent::torrent_info> *)(this_01._vptr_session_logger + 3))->
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    auVar11[0] = -((char)(ih->m_number)._M_elems[0] ==
                  (char)(peVar7->m_info_hash).v1.m_number._M_elems[0]);
    auVar11[1] = -(*(char *)((long)(ih->m_number)._M_elems + 1) ==
                  *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 1));
    auVar11[2] = -(*(char *)((long)(ih->m_number)._M_elems + 2) ==
                  *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 2));
    auVar11[3] = -(*(char *)((long)(ih->m_number)._M_elems + 3) ==
                  *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 3));
    auVar11[4] = -((char)(ih->m_number)._M_elems[1] ==
                  (char)(peVar7->m_info_hash).v1.m_number._M_elems[1]);
    auVar11[5] = -(*(char *)((long)(ih->m_number)._M_elems + 5) ==
                  *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 5));
    auVar11[6] = -(*(char *)((long)(ih->m_number)._M_elems + 6) ==
                  *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 6));
    auVar11[7] = -(*(char *)((long)(ih->m_number)._M_elems + 7) ==
                  *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 7));
    auVar11[8] = -((char)(ih->m_number)._M_elems[2] ==
                  (char)(peVar7->m_info_hash).v1.m_number._M_elems[2]);
    auVar11[9] = -(*(char *)((long)(ih->m_number)._M_elems + 9) ==
                  *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 9));
    auVar11[10] = -(*(char *)((long)(ih->m_number)._M_elems + 10) ==
                   *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 10));
    auVar11[0xb] = -(*(char *)((long)(ih->m_number)._M_elems + 0xb) ==
                    *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 0xb));
    auVar11[0xc] = -((char)(ih->m_number)._M_elems[3] ==
                    (char)(peVar7->m_info_hash).v1.m_number._M_elems[3]);
    auVar11[0xd] = -(*(char *)((long)(ih->m_number)._M_elems + 0xd) ==
                    *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 0xd));
    auVar11[0xe] = -(*(char *)((long)(ih->m_number)._M_elems + 0xe) ==
                    *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 0xe));
    auVar11[0xf] = -(*(char *)((long)(ih->m_number)._M_elems + 0xf) ==
                    *(char *)((long)(peVar7->m_info_hash).v1.m_number._M_elems + 0xf));
    uVar5 = (peVar7->m_info_hash).v1.m_number._M_elems[4];
    uVar6 = (ih->m_number)._M_elems[4];
    auVar12[0] = -((char)uVar6 == (char)uVar5);
    auVar12[1] = -((char)(uVar6 >> 8) == (char)(uVar5 >> 8));
    auVar12[2] = -((char)(uVar6 >> 0x10) == (char)(uVar5 >> 0x10));
    auVar12[3] = -((char)(uVar6 >> 0x18) == (char)(uVar5 >> 0x18));
    auVar12[4] = 0xff;
    auVar12[5] = 0xff;
    auVar12[6] = 0xff;
    auVar12[7] = 0xff;
    auVar12[8] = 0xff;
    auVar12[9] = 0xff;
    auVar12[10] = 0xff;
    auVar12[0xb] = 0xff;
    auVar12[0xc] = 0xff;
    auVar12[0xd] = 0xff;
    auVar12[0xe] = 0xff;
    auVar12[0xf] = 0xff;
    auVar12 = auVar12 & auVar11;
    torrent::add_peer((torrent *)this_01._vptr_session_logger,peer,(peer_source_flags_t)0x8,
                      (pex_flags_t)
                      (((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) * -0x80 + 0x80)
                     );
    if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
      if ((peer->impl_).data_.base.sa_family == 2) {
        local_88 = (undefined1  [8])((ulong)(peer->impl_).data_.v6.sin6_flowinfo << 0x20);
        local_80 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
        local_70._vptr_lsd_callback = (_func_int **)0x0;
      }
      else {
        local_80 = (peer->impl_).data_.v6.sin6_addr.__in6_u;
        local_70._vptr_lsd_callback = (_func_int **)(ulong)(peer->impl_).data_.v6.sin6_scope_id;
        local_88 = (undefined1  [8])0x1;
      }
      boost::asio::ip::address::to_string_abi_cxx11_(&local_68,(address *)local_88);
      (**(code **)(*this_01._vptr_session_logger + 0x38))
                (this_01._vptr_session_logger,"lsd add_peer() [ %s ]",local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                                 local_68.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    torrent::do_connect_boost((torrent *)this_01._vptr_session_logger);
    if (((this->m_alerts).m_alert_mask._M_i.m_val & 2) != 0) {
      torrent::get_handle((torrent *)local_88);
      alert_manager::
      emplace_alert<libtorrent::lsd_peer_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&>
                (&this->m_alerts,(torrent_handle *)local_88,peer);
      if ((_func_int **)local_80._0_8_ != (_func_int **)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar2 = (int *)(local_80._0_8_ + 0xc);
          iVar9 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
        }
        else {
          iVar9 = *(int *)(local_80._0_8_ + 0xc);
          *(int *)(local_80._0_8_ + 0xc) = iVar9 + -1;
        }
        if (iVar9 == 1) {
          (**(code **)(*(long *)local_80._0_8_ + 0x18))();
        }
      }
    }
  }
LAB_002d49e8:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  return;
}

Assistant:

void session_impl::on_lsd_peer(tcp::endpoint const& peer, sha1_hash const& ih)
	{
		m_stats_counters.inc_stats_counter(counters::on_lsd_peer_counter);
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		std::shared_ptr<torrent> t = find_torrent(info_hash_t(ih)).lock();
		if (!t) return;
		// don't add peers from lsd to private torrents
		if (t->torrent_file().priv() || (t->torrent_file().is_i2p()
			&& !m_settings.get_bool(settings_pack::allow_i2p_mixed))) return;

		protocol_version const v = ih == t->torrent_file().info_hashes().v1
			? protocol_version::V1 : protocol_version::V2;

		t->add_peer(peer, peer_info::lsd, v == protocol_version::V2 ? pex_lt_v2 : pex_flags_t(0));
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			t->debug_log("lsd add_peer() [ %s ]"
				, peer.address().to_string().c_str());
		}
#endif
		t->do_connect_boost();

		if (m_alerts.should_post<lsd_peer_alert>())
			m_alerts.emplace_alert<lsd_peer_alert>(t->get_handle(), peer);
	}